

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprIsTableConstraint(Expr *pExpr,SrcItem *pSrc)

{
  byte bVar1;
  uint uVar2;
  Walker WStack_38;
  
  bVar1 = (pSrc->fg).jointype;
  uVar2 = 0;
  if ((bVar1 & 0x40) == 0) {
    if ((bVar1 & 8) == 0) {
      if ((pExpr->flags & 1) != 0) {
        return 0;
      }
      WStack_38.u.n = pSrc->iCursor;
    }
    else {
      if ((pExpr->flags & 1) == 0) {
        return 0;
      }
      WStack_38.u.n = (pExpr->w).iJoin;
      if (WStack_38.u.n != pSrc->iCursor) {
        return 0;
      }
    }
    WStack_38.eCode = 3;
    WStack_38.xExprCallback = exprNodeIsConstant;
    WStack_38.xSelectCallback = sqlite3SelectWalkFail;
    walkExpr(&WStack_38,pExpr);
    uVar2 = (uint)WStack_38.eCode;
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsTableConstraint(Expr *pExpr, const SrcItem *pSrc){
  if( pSrc->fg.jointype & JT_LTORJ ){
    return 0;  /* rule (3) */
  }
  if( pSrc->fg.jointype & JT_LEFT ){
    if( !ExprHasProperty(pExpr, EP_OuterON) ) return 0;   /* rule (4a) */
    if( pExpr->w.iJoin!=pSrc->iCursor ) return 0;         /* rule (4b) */
  }else{
    if( ExprHasProperty(pExpr, EP_OuterON) ) return 0;    /* rule (5) */
  }
  return sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor); /* rules (1), (2) */
}